

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  lua_Debug ar;
  lua_Debug local_b0;
  
  iVar1 = lua_gettop(L);
  iVar5 = 1;
  iVar4 = 1;
  do {
    iVar6 = iVar5;
    iVar2 = lua_getstack(L1,iVar4,&local_b0);
    iVar5 = iVar4;
    iVar4 = iVar4 * 2;
  } while (iVar2 != 0);
  while (iVar4 = iVar5, iVar6 < iVar4) {
    iVar5 = (iVar4 + iVar6) / 2;
    iVar2 = lua_getstack(L1,iVar5,&local_b0);
    if (iVar2 != 0) {
      iVar6 = iVar5 + 1;
      iVar5 = iVar4;
    }
  }
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n");
  }
  iVar5 = lua_checkstack(L,10);
  if (iVar5 == 0) {
    luaL_error(L,"stack overflow");
  }
  lua_pushstring(L,"stack traceback:");
  iVar5 = lua_getstack(L1,level,&local_b0);
  if (iVar5 != 0) {
    uVar7 = -(uint)(-0x17 < level - iVar4) | 10;
    do {
      bVar8 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar8) {
        lua_pushstring(L,"\n\t...");
        level = iVar4 + -0xb;
      }
      else {
        lua_getinfo(L1,"Slnt",&local_b0);
        lua_pushfstring(L,"\n\t%s:",local_b0.short_src);
        if (0 < local_b0.currentline) {
          lua_pushfstring(L,"%d:");
        }
        lua_pushstring(L," in ");
        iVar5 = pushglobalfuncname(L,&local_b0);
        if (iVar5 == 0) {
          if (*local_b0.namewhat == '\0') {
            if (*local_b0.what == 'C') {
              pcVar3 = "?";
            }
            else {
              if (*local_b0.what != 'm') {
                lua_pushfstring(L,"function <%s:%d>",local_b0.short_src,
                                (ulong)(uint)local_b0.linedefined);
                goto LAB_001103f8;
              }
              pcVar3 = "main chunk";
            }
            lua_pushstring(L,pcVar3);
          }
          else {
            lua_pushfstring(L,"%s \'%s\'",local_b0.namewhat,local_b0.name);
          }
        }
        else {
          pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
          lua_pushfstring(L,"function \'%s\'",pcVar3);
          lua_rotate(L,-2,-1);
          lua_settop(L,-2);
        }
LAB_001103f8:
        if (local_b0.istailcall != '\0') {
          lua_pushstring(L,"\n\t(...tail calls...)");
        }
        level = level + 1;
        iVar5 = lua_gettop(L);
        lua_concat(L,iVar5 - iVar1);
      }
      iVar5 = lua_getstack(L1,level,&local_b0);
    } while (iVar5 != 0);
  }
  iVar5 = lua_gettop(L);
  lua_concat(L,iVar5 - iVar1);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  lua_Debug ar;
  int top = lua_gettop(L);
  int last = lastlevel(L1);
  int n1 = (last - level > LEVELS1 + LEVELS2) ? LEVELS1 : -1;
  if (msg)
    lua_pushfstring(L, "%s\n", msg);
  luaL_checkstack(L, 10, NULL);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (n1-- == 0) {  /* too many levels? */
      lua_pushliteral(L, "\n\t...");  /* add a '...' */
      level = last - LEVELS2 + 1;  /* and skip to last ones */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
      if (ar.currentline > 0)
        lua_pushfstring(L, "%d:", ar.currentline);
      lua_pushliteral(L, " in ");
      pushfuncname(L, &ar);
      if (ar.istailcall)
        lua_pushliteral(L, "\n\t(...tail calls...)");
      lua_concat(L, lua_gettop(L) - top);
    }
  }
  lua_concat(L, lua_gettop(L) - top);
}